

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O3

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::allocate_object
          (Mem<r_exec::LObject,_r_exec::MemVolatile> *this,Atom *head)

{
  Code *this_00;
  Atom *this_01;
  
  this_00 = (Code *)operator_new(0x150);
  r_code::Code::Code(this_00);
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].markers.used_cells_head = 0;
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = 0;
  this_00[1].storage_index = 0;
  this_00[1].markers.used_cells_tail = 0;
  this_00[1].markers.free_cells = 0;
  this_00[1].markers.used_cell_count = 0;
  this_00[1].markers.free_cell_count = 0;
  this_00[1].views._M_h._M_buckets = (__buckets_ptr)0x0;
  this_00[1].views._M_h._M_bucket_count = 0;
  this_00[1].views._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this_00[1].views._M_h._M_element_count = 0;
  *(undefined8 *)&this_00[1].views._M_h._M_rehash_policy = 0;
  this_00[1].views._M_h._M_rehash_policy._M_next_resize = 0;
  this_00[1].views._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00[2].super__Object._vptr__Object = (_func_int **)0x0;
  this_00[2].super__Object.refCount.super___atomic_base<long>._M_i = 0;
  this_00[2].storage_index = 0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].super__Object._vptr__Object = (_func_int **)0xffffffff;
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__Object_0011c7a0;
  this_01 = r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)&this_00[1].super__Object.refCount,0);
  r_code::Atom::operator=(this_01,head);
  return this_00;
}

Assistant:

r_code::Code *Mem<O, S>::allocate_object(Atom head) const
{
    r_code::Code *object = new O();
    object->code(0) = head;
    return object;
}